

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O3

void __thiscall
xLearn::F1Metric::Accumulate
          (F1Metric *this,vector<float,_std::allocator<float>_> *Y,
          vector<float,_std::allocator<float>_> *pred)

{
  ThreadPool *pTVar1;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ostream *poVar6;
  index_t iVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sum_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sum_1;
  allocator_type local_b9;
  vector<float,_std::allocator<float>_> *local_b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b0;
  string local_98;
  string local_78;
  pointer local_58;
  vector<float,_std::allocator<float>_> *local_50;
  vector<float,_std::allocator<float>_> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  uVar3 = (long)(Y->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(Y->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start;
  local_b8 = Y;
  if (uVar3 != (long)(pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric.h"
               ,"");
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Accumulate","");
    poVar6 = Logger::Start(ERR,&local_78,0x198,&local_98);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"CHECK_EQ failed ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric.h"
               ,0x5b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0x198);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Y.size()",8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"pred.size()",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::operator<<(poVar6,"\n");
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    Logger::~Logger((Logger *)&local_b0);
    abort();
  }
  this->total_example_ = this->total_example_ + (int)(uVar3 >> 2);
  local_78._M_dataplus._M_p = local_78._M_dataplus._M_p & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_98,
             (this->super_Metric).threadNumber_,(value_type_conflict2 *)&local_78,
             (allocator_type *)&local_b0);
  local_78._M_dataplus._M_p = local_78._M_dataplus._M_p & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_b0,(this->super_Metric).threadNumber_,(value_type_conflict2 *)&local_78,
             &local_b9);
  uVar3 = (this->super_Metric).threadNumber_;
  if (uVar3 == 0) {
    uVar3 = 0;
  }
  else {
    lVar11 = 0;
    uVar9 = 0;
    do {
      uVar4 = (long)(pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 2;
      uVar5 = uVar4 / uVar3;
      local_78._M_dataplus._M_p = (pointer)f1_accum_thread;
      local_78.field_2._M_allocated_capacity = uVar5 * uVar9;
      uVar10 = uVar9 + 1;
      uVar5 = uVar5 * uVar10;
      local_78._M_string_length = uVar4 % uVar3 + uVar5;
      if (uVar9 != uVar3 - 1) {
        local_78._M_string_length = uVar5;
      }
      local_58 = local_98._M_dataplus._M_p + lVar11;
      local_78.field_2._8_8_ =
           CONCAT44(local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start._4_4_,
                    local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start._0_4_) + lVar11;
      local_48 = local_b8;
      local_50 = pred;
      ThreadPool::
      enqueue<std::_Bind<void(*(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,unsigned_int*,unsigned_int*,unsigned_long,unsigned_long))(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,unsigned_int*,unsigned_int*,unsigned_long,unsigned_long)>>
                ((ThreadPool *)&stack0xffffffffffffffc0,
                 (_Bind<void_(*(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long))(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_int_*,_unsigned_long,_unsigned_long)>
                  *)(this->super_Metric).pool_);
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      }
      uVar3 = (this->super_Metric).threadNumber_;
      lVar11 = lVar11 + 4;
      uVar9 = uVar10;
    } while (uVar10 < uVar3);
  }
  pTVar1 = (this->super_Metric).pool_;
  local_78._M_dataplus._M_p = (pointer)&pTVar1->sync_mutex;
  local_78._M_string_length = local_78._M_string_length & 0xffffffffffffff00;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_78);
  local_78._M_string_length = CONCAT71(local_78._M_string_length._1_7_,1);
  if ((pTVar1->sync).super___atomic_base<int>._M_i != (int)uVar3) {
    do {
      std::condition_variable::wait((unique_lock *)&pTVar1->sync_condition);
    } while ((pTVar1->sync).super___atomic_base<int>._M_i != (int)uVar3);
  }
  LOCK();
  (pTVar1->sync).super___atomic_base<int>._M_i = 0;
  UNLOCK();
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_78);
  if (local_98._M_string_length - (long)local_98._M_dataplus._M_p != 0) {
    iVar7 = this->true_positive_;
    lVar11 = (long)(local_98._M_string_length - (long)local_98._M_dataplus._M_p) >> 2;
    lVar8 = 0;
    do {
      iVar7 = iVar7 + *(int *)(local_98._M_dataplus._M_p + lVar8 * 4);
      lVar8 = lVar8 + 1;
      this->true_positive_ = iVar7;
    } while (lVar11 + (ulong)(lVar11 == 0) != lVar8);
  }
  pvVar2 = (void *)CONCAT44(local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_4_);
  if ((long)local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pvVar2 == 0) {
    if (pvVar2 == (void *)0x0) goto LAB_00131907;
  }
  else {
    iVar7 = this->true_negative_;
    lVar11 = (long)local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pvVar2 >> 2;
    lVar8 = 0;
    do {
      iVar7 = iVar7 + *(int *)((long)pvVar2 + lVar8 * 4);
      lVar8 = lVar8 + 1;
      this->true_negative_ = iVar7;
    } while (lVar11 + (ulong)(lVar11 == 0) != lVar8);
  }
  operator_delete(pvVar2);
LAB_00131907:
  if (local_98._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Accumulate(const std::vector<real_t>& Y,
                  const std::vector<real_t>& pred) {
    CHECK_EQ(Y.size(), pred.size());
    total_example_ += Y.size();
    // multi-thread training
    std::vector<index_t> sum_1(threadNumber_, 0);
    std::vector<index_t> sum_2(threadNumber_, 0);
    for (int i = 0; i < threadNumber_; ++i) {
      size_t start_idx = getStart(pred.size(), threadNumber_, i);
      size_t end_idx = getEnd(pred.size(), threadNumber_, i);
      pool_->enqueue(std::bind(f1_accum_thread,
                               &Y,
                               &pred,
                               &(sum_1[i]),
                               &(sum_2[i]),
                               start_idx,
                               end_idx));
    }
    // Wait all of the threads finish their job
    pool_->Sync(threadNumber_);
    for (size_t i = 0; i < sum_1.size(); ++i) {
      true_positive_ += sum_1[i];
    }
    for (size_t i = 0; i < sum_2.size(); ++i) {
      true_negative_ += sum_2[i];
    }
  }